

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

void md5_ez(char *hash,char *msg,size_t len)

{
  ulong uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [16];
  md5_byte_t digest [16];
  ulong local_78 [2];
  md5_state_t local_68;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  local_68.count[0] = 0;
  local_68.count[1] = 0;
  local_68.abcd[0] = 0x67452301;
  local_68.abcd[1] = 0xefcdab89;
  local_68.abcd[2] = 0x98badcfe;
  local_68.abcd[3] = 0x10325476;
  md5_append(&local_68,(md5_byte_t *)msg,(int)len);
  md5_finish(&local_68,(md5_byte_t *)local_78);
  auVar5 = _DAT_0029b270;
  auVar4 = _s_00000000_0029b250;
  auVar3 = _DAT_0029b230;
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)((long)local_78 + lVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar1;
    auVar9._0_2_ = (ushort)uVar1 >> 4;
    auVar9._2_2_ = (ushort)(uVar1 >> 0x10) >> 4;
    auVar9._4_2_ = (ushort)(uVar1 >> 0x20) >> 4;
    auVar9._6_2_ = (ushort)(uVar1 >> 0x34);
    auVar9._8_8_ = 0;
    auVar9 = auVar9 & auVar3;
    bVar11 = (byte)uVar1;
    bVar22 = (byte)(uVar1 >> 8);
    bVar23 = (byte)(uVar1 >> 0x10);
    bVar24 = (byte)(uVar1 >> 0x18);
    bVar25 = (byte)(uVar1 >> 0x20);
    bVar26 = (byte)(uVar1 >> 0x28);
    bVar27 = (byte)(uVar1 >> 0x30);
    bVar2 = (byte)(uVar1 >> 0x38);
    auVar12[0] = -((byte)((bVar11 < 0xa0) * -0x60 | (bVar11 >= 0xa0) * bVar11) == bVar11);
    auVar12[1] = -((byte)((bVar22 < 0xa0) * -0x60 | (bVar22 >= 0xa0) * bVar22) == bVar22);
    auVar12[2] = -((byte)((bVar23 < 0xa0) * -0x60 | (bVar23 >= 0xa0) * bVar23) == bVar23);
    auVar12[3] = -((byte)((bVar24 < 0xa0) * -0x60 | (bVar24 >= 0xa0) * bVar24) == bVar24);
    auVar12[4] = -((byte)((bVar25 < 0xa0) * -0x60 | (bVar25 >= 0xa0) * bVar25) == bVar25);
    auVar12[5] = -((byte)((bVar26 < 0xa0) * -0x60 | (bVar26 >= 0xa0) * bVar26) == bVar26);
    auVar12[6] = -((byte)((bVar27 < 0xa0) * -0x60 | (bVar27 >= 0xa0) * bVar27) == bVar27);
    auVar12[7] = -((byte)((bVar2 < 0xa0) * -0x60 | (bVar2 >= 0xa0) * bVar2) == bVar2);
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar13[0] = auVar9[0] + '7';
    auVar13[1] = auVar9[1] + '7';
    auVar13[2] = auVar9[2] + '7';
    auVar13[3] = auVar9[3] + '7';
    auVar13[4] = auVar9[4] + '7';
    auVar13[5] = auVar9[5] + '7';
    auVar13[6] = auVar9[6] + '7';
    auVar13[7] = auVar9[7] + '7';
    auVar13[8] = auVar9[8];
    auVar13[9] = auVar9[9];
    auVar13[10] = auVar9[10];
    auVar13[0xb] = auVar9[0xb];
    auVar13[0xc] = auVar9[0xc];
    auVar13[0xd] = auVar9[0xd];
    auVar13[0xe] = auVar9[0xe];
    auVar13 = ~auVar12 & (auVar9._0_15_ | auVar4._0_15_) | auVar13 & auVar12;
    auVar7 = auVar7 & auVar5;
    auVar10[0] = -('\t' < auVar7[0]);
    auVar10[1] = -('\t' < auVar7[1]);
    auVar10[2] = -('\t' < auVar7[2]);
    auVar10[3] = -('\t' < auVar7[3]);
    auVar10[4] = -('\t' < auVar7[4]);
    auVar10[5] = -('\t' < auVar7[5]);
    auVar10[6] = -('\t' < auVar7[6]);
    auVar10[7] = -('\t' < auVar7[7]);
    auVar10[8] = -('\0' < auVar7[8]);
    auVar10[9] = -('\0' < auVar7[9]);
    auVar10[10] = -('\0' < auVar7[10]);
    auVar10[0xb] = -('\0' < auVar7[0xb]);
    auVar10[0xc] = -('\0' < auVar7[0xc]);
    auVar10[0xd] = -('\0' < auVar7[0xd]);
    auVar10[0xe] = -('\0' < auVar7[0xe]);
    auVar10[0xf] = -('\0' < auVar7[0xf]);
    auVar8[0] = auVar7[0] + '7';
    auVar8[1] = auVar7[1] + '7';
    auVar8[2] = auVar7[2] + '7';
    auVar8[3] = auVar7[3] + '7';
    auVar8[4] = auVar7[4] + '7';
    auVar8[5] = auVar7[5] + '7';
    auVar8[6] = auVar7[6] + '7';
    auVar8[7] = auVar7[7] + '7';
    auVar8[8] = auVar7[8];
    auVar8[9] = auVar7[9];
    auVar8[10] = auVar7[10];
    auVar8[0xb] = auVar7[0xb];
    auVar8[0xc] = auVar7[0xc];
    auVar8[0xd] = auVar7[0xd];
    auVar8[0xe] = auVar7[0xe];
    auVar8[0xf] = auVar7[0xf];
    auVar7 = ~auVar10 & (auVar7 | auVar4) | auVar8 & auVar10;
    auVar21._0_14_ = auVar13._0_14_;
    auVar21[0xe] = auVar13[7];
    auVar21[0xf] = auVar7[7];
    auVar20._14_2_ = auVar21._14_2_;
    auVar20._0_13_ = auVar13._0_13_;
    auVar20[0xd] = auVar7[6];
    auVar19._13_3_ = auVar20._13_3_;
    auVar19._0_12_ = auVar13._0_12_;
    auVar19[0xc] = auVar13[6];
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._0_11_ = auVar13._0_11_;
    auVar18[0xb] = auVar7[5];
    auVar17._11_5_ = auVar18._11_5_;
    auVar17._0_10_ = auVar13._0_10_;
    auVar17[10] = auVar13[5];
    auVar16._10_6_ = auVar17._10_6_;
    auVar16._0_9_ = auVar13._0_9_;
    auVar16[9] = auVar7[4];
    auVar15._9_7_ = auVar16._9_7_;
    auVar15._0_8_ = auVar13._0_8_;
    auVar15[8] = auVar13[4];
    auVar14._8_8_ = auVar15._8_8_;
    auVar14[7] = auVar7[3];
    auVar14[6] = auVar13[3];
    auVar14[5] = auVar7[2];
    auVar14[4] = auVar13[2];
    auVar14[3] = auVar7[1];
    auVar14[2] = auVar13[1];
    auVar14[0] = auVar13[0];
    auVar14[1] = auVar7[0];
    *(undefined1 (*) [16])(hash + lVar6 * 2) = auVar14;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x10);
  hash[0x20] = '\0';
  return;
}

Assistant:

void md5_ez(char *hash, const char *msg, size_t len)
{
    md5_state_t s;
    md5_byte_t digest[16];

    /* calculate the binary md5 of the message */
    md5_init(&s);
    md5_append(&s, (const md5_byte_t *)msg, len);
    md5_finish(&s, digest);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < 16 ; ++i, hash += 2)
        byte_to_xdigits(hash, digest[i]);

    /* null-terminate the output string */
    *hash = '\0';
}